

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::write
          (HttpChunkedEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  undefined1 auVar2 [8];
  long *plVar3;
  ArrayPtr<const_char> *pAVar4;
  undefined8 uVar5;
  HttpOutputStream *pHVar6;
  long lVar7;
  PromiseNode *pPVar8;
  undefined4 in_register_00000034;
  unsigned_long i;
  undefined1 *puVar9;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> partsBuilder;
  Array<kj::ArrayPtr<const_unsigned_char>_> parts;
  Promise<void> promise;
  String header;
  undefined1 local_98 [8];
  long lStack_90;
  long local_88;
  undefined8 *local_80;
  long *local_78;
  ArrayPtr<const_char> *pAStack_70;
  undefined8 *local_68;
  undefined1 local_58 [24];
  PromiseNode *pPStack_40;
  undefined8 *local_38;
  
  if (__n == 0) {
    i = 0;
  }
  else {
    lVar7 = 0;
    i = 0;
    do {
      i = i + *(long *)((long)__buf + lVar7 + 8);
      lVar7 = lVar7 + 0x10;
    } while (__n << 4 != lVar7);
  }
  if (i == 0) {
    kj::_::readyNow();
    (this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)local_98;
  }
  else {
    hex((CappedArray<char,_17UL> *)local_98,i);
    local_78 = &lStack_90;
    pAStack_70 = (ArrayPtr<const_char> *)local_98;
    local_58._0_8_ = (long)"0\r\n\r\n" + 3;
    local_58._8_8_ = (AsyncOutputStream *)0x2;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)(local_58 + 0x10),(_ *)&local_78,(ArrayPtr<const_char> *)local_58,
               (ArrayPtr<const_char> *)local_98);
    local_78 = (long *)kj::_::HeapArrayDisposer::allocateImpl
                                 (0x10,0,__n + 2,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
    local_80 = &kj::_::HeapArrayDisposer::instance;
    pPVar8 = pPStack_40;
    if (pPStack_40 != (PromiseNode *)0x0) {
      pPVar8 = (PromiseNode *)local_58._16_8_;
    }
    puVar9 = (undefined1 *)0x0;
    if (pPStack_40 != (PromiseNode *)0x0) {
      puVar9 = (undefined1 *)((long)&pPStack_40[-1].super_PromiseArenaMember.arena + 7);
    }
    *local_78 = (long)pPVar8;
    local_78[1] = (long)puVar9;
    lStack_90 = (long)(local_78 + 2);
    if (__n != 0) {
      lVar7 = 0;
      do {
        lVar1 = ((long *)((long)__buf + lVar7))[1];
        *(long *)lStack_90 = *(long *)((long)__buf + lVar7);
        *(long *)(lStack_90 + 8) = lVar1;
        lStack_90 = lStack_90 + 0x10;
        lVar7 = lVar7 + 0x10;
      } while (__n << 4 != lVar7);
    }
    *(undefined2 **)lStack_90 = &kj::_::ByteLiteral<3ul>;
    *(long *)(lStack_90 + 8) = 2;
    pAStack_70 = (ArrayPtr<const_char> *)(lStack_90 + (0x10 - (long)local_78) >> 4);
    local_68 = &kj::_::HeapArrayDisposer::instance;
    local_98 = (undefined1  [8])0x0;
    lStack_90 = 0;
    local_88 = 0;
    pHVar6 = HttpEntityBodyWriter::getInner
                       ((HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd));
    pieces.size_ = (size_t)local_78;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar6;
    HttpOutputStream::writeBodyData((HttpOutputStream *)local_58,pieces);
    Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Promise<void> *)this,(String *)local_58,
               (Array<kj::ArrayPtr<const_unsigned_char>_> *)(local_58 + 0x10));
    uVar5 = local_58._0_8_;
    if ((Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)local_58._0_8_ !=
        (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0) {
      local_58._0_8_ = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar5);
    }
    pAVar4 = pAStack_70;
    plVar3 = local_78;
    if (local_78 != (long *)0x0) {
      local_78 = (long *)0x0;
      pAStack_70 = (ArrayPtr<const_char> *)0x0;
      (**(code **)*local_68)(local_68,plVar3,0x10,pAVar4,pAVar4,0);
    }
    lVar1 = local_88;
    lVar7 = lStack_90;
    auVar2 = local_98;
    if (local_98 != (undefined1  [8])0x0) {
      local_98 = (undefined1  [8])0x0;
      lStack_90 = 0;
      local_88 = 0;
      (**(code **)*local_80)
                (local_80,auVar2,0x10,lVar7 - (long)auVar2 >> 4,lVar1 - (long)auVar2 >> 4,0);
    }
    pPVar8 = pPStack_40;
    uVar5 = local_58._16_8_;
    if ((PromiseNode *)local_58._16_8_ != (PromiseNode *)0x0) {
      local_58._16_8_ = (PromiseNode *)0x0;
      pPStack_40 = (PromiseNode *)0x0;
      (**(code **)*local_38)(local_38,uVar5,1,pPVar8,pPVar8,0);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) return kj::READY_NOW;  // can't encode zero-size chunk since it indicates EOF.

    auto header = kj::str(kj::hex(size), "\r\n");
    auto partsBuilder = kj::heapArrayBuilder<ArrayPtr<const byte>>(pieces.size() + 2);
    partsBuilder.add(header.asBytes());
    for (auto& piece: pieces) {
      partsBuilder.add(piece);
    }
    partsBuilder.add("\r\n"_kjb);

    auto parts = partsBuilder.finish();
    auto promise = getInner().writeBodyData(parts.asPtr());
    return promise.attach(kj::mv(header), kj::mv(parts));
  }